

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.cpp
# Opt level: O2

vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
* __thiscall
dg::dda::LLVMReadWriteGraphBuilder::mapPointers
          (vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
           *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,Value *where,Value *val,
          Offset size)

{
  type tVar1;
  LLVMPointsToSetImpl *pLVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  size_type __n;
  undefined1 auVar6 [16];
  RWNode *ptrNode;
  const_iterator __begin2;
  const_iterator __end2;
  char local_78 [8];
  LLVMPointsToSetImpl *local_70;
  type local_68;
  Offset local_60;
  RWNode *local_58;
  undefined1 local_50 [8];
  Offset local_48;
  const_iterator local_40;
  const_iterator local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = size.offset;
  (**(code **)(*(long *)this->PTA + 0x10))(local_78,this->PTA,val);
  if ((local_78[0] == '\0') || (lVar5 = (**(code **)(*(long *)local_70 + 0x20))(), lVar5 == 0)) {
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::emplace_back<dg::dda::RWNode*&>
              ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)__return_storage_ptr__,(RWNode **)&UNKNOWN_MEMORY);
  }
  else {
    __n = (**(code **)(*(long *)local_70 + 0x20))();
    std::
    vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
    ::reserve(__return_storage_ptr__,__n);
    cVar3 = (*(code *)**(undefined8 **)local_70)();
    if (cVar3 != '\0') {
      std::
      vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::emplace_back<dg::dda::RWNode*&>
                ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)__return_storage_ptr__,(RWNode **)&UNKNOWN_MEMORY);
    }
    pLVar2 = local_70;
    if (local_70 == (LLVMPointsToSetImpl *)0x0) {
      local_40.impl = (LLVMPointsToSetImpl *)0x0;
    }
    else {
      cVar3 = (**(code **)(*(long *)local_70 + 0x38))(local_70);
      local_40.impl = (LLVMPointsToSetImpl *)0x0;
      if (cVar3 == '\0') {
        local_40.impl = pLVar2;
      }
    }
    tVar1 = Offset::UNKNOWN;
    local_38.impl = (LLVMPointsToSetImpl *)0x0;
    while( true ) {
      bVar4 = LLVMPointsToSet::const_iterator::operator!=(&local_40,&local_38);
      if (!bVar4) break;
      auVar6 = (**(code **)(*(long *)local_40.impl + 0x48))();
      _local_50 = auVar6;
      if (auVar6._0_8_[0x10] != (Value)0x0) {
        local_58 = getOperand(this,auVar6._0_8_);
        local_60.offset = local_68;
        if (local_48.offset == tVar1) {
          local_60.offset = tVar1;
        }
        std::
        vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
        ::emplace_back<dg::dda::RWNode*&,dg::Offset_const&,dg::Offset>
                  ((vector<dg::dda::GenericDefSite<dg::dda::RWNode>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                    *)__return_storage_ptr__,&local_58,&local_48,&local_60);
      }
      LLVMPointsToSet::const_iterator::operator++(&local_40);
    }
  }
  if (local_70 != (LLVMPointsToSetImpl *)0x0) {
    (**(code **)(*(long *)local_70 + 0x58))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DefSite>
LLVMReadWriteGraphBuilder::mapPointers(const llvm::Value *where,
                                       const llvm::Value *val, Offset size) {
    std::vector<DefSite> result;

    auto psn = PTA->getLLVMPointsToChecked(val);
    if (!psn.first) {
        result.emplace_back(UNKNOWN_MEMORY);
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "No points-to set for: " << ValInfo(val) << "\n";
#endif
        // don't have points-to information for used pointer
        return result;
    }

    if (psn.second.empty()) {
#ifndef NDEBUG
        llvm::errs() << "[RWG] warning at: " << ValInfo(where) << "\n";
        llvm::errs() << "Empty points-to set for: " << ValInfo(val) << "\n";
#endif
        // this may happen on invalid reads and writes to memory,
        // like when you try for example this:
        //
        //   int p, q;
        //   memcpy(p, q, sizeof p);
        //
        // (there should be &p and &q)
        // NOTE: maybe this is a bit strong to say unknown memory,
        // but better be sound then incorrect
        result.emplace_back(UNKNOWN_MEMORY);
        return result;
    }

    result.reserve(psn.second.size());

    if (psn.second.hasUnknown()) {
        result.emplace_back(UNKNOWN_MEMORY);
    }

    for (const auto &ptr : psn.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        RWNode *ptrNode = getOperand(ptr.value);
        if (!ptrNode) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(where) << "\n";
                llvm::errs() << "[RWG] error for " << ValInfo(val) << "\n";
                llvm::errs() << "[RWG] error: Cannot find node for "
                             << ValInfo(ptr.value) << "\n";
            }
            continue;
        }

        // FIXME: we should pass just size to the DefSite ctor, but the old code
        // relies on the behavior that when offset is unknown, the length is
        // also unknown. So for now, mimic the old code. Remove it once we fix
        // the old code.
        result.emplace_back(ptrNode, ptr.offset,
                            ptr.offset.isUnknown() ? Offset::UNKNOWN : size);
    }

    return result;
}